

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int compute_action(lemon *lemp,action *ap)

{
  int iVar1;
  
  switch(ap->type) {
  case SHIFT:
    return ((ap->x).stp)->statenum;
  case ACCEPT:
    return lemp->accAction;
  case REDUCE:
    iVar1 = ((ap->x).rp)->iRule;
    break;
  case ERROR:
    return lemp->errAction;
  default:
    return -1;
  case SHIFTREDUCE:
    iVar1 = ((ap->x).rp)->iRule;
    if (ap->sp->index < lemp->nterminal) {
      return iVar1 + lemp->minShiftReduce;
    }
  }
  return iVar1 + lemp->minReduce;
}

Assistant:

PRIVATE int compute_action(struct lemon *lemp, struct action *ap)
{
  int act;
  switch( ap->type ){
    case SHIFT:  act = ap->x.stp->statenum;                        break;
    case SHIFTREDUCE: {
      /* Since a SHIFT is inherient after a prior REDUCE, convert any
      ** SHIFTREDUCE action with a nonterminal on the LHS into a simple
      ** REDUCE action: */
      if( ap->sp->index>=lemp->nterminal ){
        act = lemp->minReduce + ap->x.rp->iRule;
      }else{
        act = lemp->minShiftReduce + ap->x.rp->iRule;
      }
      break;
    }
    case REDUCE: act = lemp->minReduce + ap->x.rp->iRule;          break;
    case ERROR:  act = lemp->errAction;                            break;
    case ACCEPT: act = lemp->accAction;                            break;
    default:     act = -1; break;
  }
  return act;
}